

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.cpp
# Opt level: O3

void Diligent::ValidateRenderPassDesc
               (RenderPassDesc *Desc,RenderDeviceInfo *DeviceInfo,GraphicsAdapterInfo *AdapterInfo)

{
  Uint32 *pUVar1;
  RESOURCE_STATE RVar2;
  char *pcVar3;
  AttachmentReference *pAVar4;
  SubpassDesc *pSVar5;
  SubpassDependencyDesc *pSVar6;
  byte bVar7;
  RESOURCE_STATE RVar8;
  uint uVar9;
  TextureFormatAttribs *pTVar10;
  ulong uVar11;
  TextureFormatAttribs *Args_12;
  ShadingRateAttachment *pSVar12;
  uint uVar13;
  ShadingRateAttachment *Args_1;
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE extraout_EDX_00;
  GraphicsAdapterInfo *extraout_RDX;
  GraphicsAdapterInfo *extraout_RDX_00;
  GraphicsAdapterInfo *extraout_RDX_01;
  GraphicsAdapterInfo *extraout_RDX_02;
  GraphicsAdapterInfo *extraout_RDX_03;
  GraphicsAdapterInfo *extraout_RDX_04;
  GraphicsAdapterInfo *extraout_RDX_05;
  GraphicsAdapterInfo *extraout_RDX_06;
  GraphicsAdapterInfo *extraout_RDX_07;
  GraphicsAdapterInfo *extraout_RDX_08;
  GraphicsAdapterInfo *extraout_RDX_09;
  GraphicsAdapterInfo *extraout_RDX_10;
  GraphicsAdapterInfo *extraout_RDX_11;
  GraphicsAdapterInfo *extraout_RDX_12;
  GraphicsAdapterInfo *extraout_RDX_13;
  GraphicsAdapterInfo *extraout_RDX_14;
  GraphicsAdapterInfo *extraout_RDX_15;
  GraphicsAdapterInfo *extraout_RDX_16;
  GraphicsAdapterInfo *extraout_RDX_17;
  GraphicsAdapterInfo *extraout_RDX_18;
  GraphicsAdapterInfo *extraout_RDX_19;
  GraphicsAdapterInfo *extraout_RDX_20;
  GraphicsAdapterInfo *extraout_RDX_21;
  GraphicsAdapterInfo *extraout_RDX_22;
  GraphicsAdapterInfo *extraout_RDX_23;
  GraphicsAdapterInfo *extraout_RDX_24;
  GraphicsAdapterInfo *extraout_RDX_25;
  GraphicsAdapterInfo *extraout_RDX_26;
  GraphicsAdapterInfo *extraout_RDX_27;
  GraphicsAdapterInfo *extraout_RDX_28;
  GraphicsAdapterInfo *extraout_RDX_29;
  GraphicsAdapterInfo *extraout_RDX_30;
  GraphicsAdapterInfo *extraout_RDX_31;
  GraphicsAdapterInfo *extraout_RDX_32;
  GraphicsAdapterInfo *extraout_RDX_33;
  GraphicsAdapterInfo *extraout_RDX_34;
  GraphicsAdapterInfo *extraout_RDX_35;
  Diligent *this;
  RenderPassAttachmentDesc *pRVar14;
  AttachmentReference *AttchRef;
  AttachmentReference *Args_4;
  Uint32 *pUVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  uint local_d4;
  char *local_d0;
  string msg;
  Uint32 PrsvAttachment;
  uint uStack_a4;
  RENDER_DEVICE_TYPE local_a0;
  uint local_9c;
  Uint32 *local_98;
  ShadingRateAttachment *local_90;
  Uint32 *local_88;
  Uint32 *local_80;
  GraphicsAdapterInfo *local_78;
  Uint32 *local_70;
  Uint32 *local_68;
  Uint32 *local_60;
  Uint32 *local_58;
  char *local_50;
  RenderDeviceInfo *local_48;
  char *local_40;
  char *local_38;
  
  local_a0 = DeviceInfo->Type;
  pUVar1 = &Desc->AttachmentCount;
  local_78 = AdapterInfo;
  local_48 = DeviceInfo;
  if ((Desc->AttachmentCount != 0) && (Desc->pAttachments == (RenderPassAttachmentDesc *)0x0)) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x33,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [23])0x756555,pUVar1,
               (char (*) [41])") is not zero, but pAttachments is null.");
    AdapterInfo = extraout_RDX;
  }
  if (Desc->SubpassCount == 0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[44]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x3a,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [44])"render pass must have at least one subpass.");
    AdapterInfo = extraout_RDX_00;
  }
  if (Desc->pSubpasses == (SubpassDesc *)0x0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[29]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x40,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [29])"pSubpasses must not be null.");
    AdapterInfo = extraout_RDX_01;
  }
  local_88 = &Desc->DependencyCount;
  if ((Desc->DependencyCount != 0) && (Desc->pDependencies == (SubpassDependencyDesc *)0x0)) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[42]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x48,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [23])"the dependency count (",local_88,
               (char (*) [42])") is not zero, but pDependencies is null.");
    AdapterInfo = extraout_RDX_02;
  }
  _PrsvAttachment = (char *)((ulong)uStack_a4 << 0x20);
  local_98 = pUVar1;
  if (*pUVar1 != 0) {
    RVar8 = RESOURCE_STATE_UNKNOWN;
    do {
      pRVar14 = Desc->pAttachments;
      if (pRVar14[RVar8].Format == TEX_FORMAT_UNKNOWN) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[26],unsigned_int,char[13]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x4f,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [26])"the format of attachment ",
                   &PrsvAttachment,(char (*) [13])" is unknown.");
      }
      pRVar14 = pRVar14 + RVar8;
      bVar7 = pRVar14->SampleCount;
      if (bVar7 == 0) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[10]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x52,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [32])"the sample count of attachment "
                   ,&PrsvAttachment,(char (*) [10])0x7586e7);
        bVar7 = pRVar14->SampleCount;
        if (bVar7 != 0) goto LAB_004dd0b7;
        bVar7 = 0;
LAB_004dd0c2:
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        local_d0 = (char *)CONCAT44(local_d0._4_4_,(uint)bVar7);
        LogError<true,char[29],char_const*,char[15],char[19],unsigned_int,char[17],unsigned_int,char[22]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x55,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [19])0x75649c,(uint *)&local_d0,
                   (char (*) [17])") of attachment ",&PrsvAttachment,
                   (char (*) [22])" is not power of two.");
      }
      else {
LAB_004dd0b7:
        if ((bVar7 & bVar7 - 1) != 0) goto LAB_004dd0c2;
      }
      pTVar10 = GetTextureFormatAttribs(pRVar14->Format);
      RVar8 = pRVar14->InitialState;
      this = (Diligent *)(ulong)RVar8;
      AdapterInfo = extraout_RDX_03;
      if ((byte)(pTVar10->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
        if ((int)RVar8 < 0x800) {
          if (((0x3f < RVar8 - RESOURCE_STATE_UNDEFINED) ||
              ((0x8000000080000001U >> ((ulong)(RVar8 - RESOURCE_STATE_UNDEFINED) & 0x3f) & 1) == 0)
              ) && ((RVar8 != RESOURCE_STATE_DEPTH_READ && (RVar8 != RESOURCE_STATE_SHADER_RESOURCE)
                    ))) goto LAB_004dd3fe;
        }
        else if ((int)RVar8 < 0x2000) {
          if ((RVar8 != RESOURCE_STATE_COPY_DEST) && (RVar8 != RESOURCE_STATE_COPY_SOURCE))
          goto LAB_004dd3fe;
        }
        else if ((RVar8 != RESOURCE_STATE_RESOLVE_DEST) &&
                ((RVar8 != RESOURCE_STATE_RESOLVE_SOURCE &&
                 (RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT)))) {
LAB_004dd3fe:
          if ((local_a0 != RENDER_DEVICE_TYPE_VULKAN) || (RVar8 != RESOURCE_STATE_COMMON)) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_(&msg,this,(RESOURCE_STATE)extraout_RDX_03);
            LogError<true,char[29],char_const*,char[15],char[47],unsigned_int,char[3],std::__cxx11::string,char[14]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x67,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [47])"the initial state of depth-stencil attachment ",
                       &PrsvAttachment,(char (*) [3])0x6b3b90,&msg,(char (*) [14])") is invalid.");
            AdapterInfo = extraout_RDX_07;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              AdapterInfo = extraout_RDX_08;
            }
          }
        }
        RVar8 = pRVar14->FinalState;
        if ((int)RVar8 < 0x800) {
          if ((int)RVar8 < 0x80) {
            if ((RVar8 != RESOURCE_STATE_UNORDERED_ACCESS) && (RVar8 != RESOURCE_STATE_DEPTH_WRITE))
            goto LAB_004dd50e;
          }
          else if ((RVar8 != RESOURCE_STATE_DEPTH_READ) && (RVar8 != RESOURCE_STATE_SHADER_RESOURCE)
                  ) goto LAB_004dd50e;
        }
        else if ((int)RVar8 < 0x2000) {
          if ((RVar8 != RESOURCE_STATE_COPY_DEST) && (RVar8 != RESOURCE_STATE_COPY_SOURCE))
          goto LAB_004dd50e;
        }
        else if ((RVar8 != RESOURCE_STATE_RESOLVE_DEST) &&
                ((RVar8 != RESOURCE_STATE_RESOLVE_SOURCE &&
                 (RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT)))) {
LAB_004dd50e:
          if ((local_a0 != RENDER_DEVICE_TYPE_VULKAN) || (RVar8 != RESOURCE_STATE_COMMON)) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_
                      (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
            LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[3],std::__cxx11::string,char[14]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x75,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [45])"the final state of depth-stencil attachment ",&PrsvAttachment
                       ,(char (*) [3])0x6b3b90,&msg,(char (*) [14])") is invalid.");
            AdapterInfo = extraout_RDX_09;
LAB_004dd57d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              AdapterInfo = extraout_RDX_10;
            }
          }
        }
      }
      else {
        if ((int)RVar8 < 0x1000) {
          if ((((RESOURCE_STATE_UNORDERED_ACCESS < RVar8) ||
               ((0x100010002U >> ((ulong)this & 0x3f) & 1) == 0)) &&
              (RVar8 != RESOURCE_STATE_SHADER_RESOURCE)) && (RVar8 != RESOURCE_STATE_COPY_DEST))
          goto LAB_004dd246;
        }
        else if ((int)RVar8 < 0x8000) {
          if (((RVar8 != RESOURCE_STATE_COPY_SOURCE) && (RVar8 != RESOURCE_STATE_RESOLVE_DEST)) &&
             (RVar8 != RESOURCE_STATE_RESOLVE_SOURCE)) {
LAB_004dd246:
            if ((local_a0 != RENDER_DEVICE_TYPE_VULKAN) || (RVar8 != RESOURCE_STATE_COMMON)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              GetResourceStateString_abi_cxx11_(&msg,this,(RESOURCE_STATE)extraout_RDX_03);
              LogError<true,char[29],char_const*,char[15],char[39],unsigned_int,char[3],std::__cxx11::string,char[14]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x87,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [39])"the initial state of color attachment ",&PrsvAttachment,
                         (char (*) [3])0x6b3b90,&msg,(char (*) [14])") is invalid.");
              AdapterInfo = extraout_RDX_04;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                AdapterInfo = extraout_RDX_05;
              }
            }
          }
        }
        else if (((RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT) && (RVar8 != RESOURCE_STATE_PRESENT))
                && (RVar8 != RESOURCE_STATE_MAX_BIT)) goto LAB_004dd246;
        RVar8 = pRVar14->FinalState;
        if ((int)RVar8 < 0x1000) {
          if ((int)RVar8 < 0x100) {
            if ((RVar8 != RESOURCE_STATE_RENDER_TARGET) &&
               (RVar8 != RESOURCE_STATE_UNORDERED_ACCESS)) goto LAB_004dd359;
          }
          else if ((RVar8 != RESOURCE_STATE_SHADER_RESOURCE) && (RVar8 != RESOURCE_STATE_COPY_DEST))
          goto LAB_004dd359;
        }
        else if ((int)RVar8 < 0x4000) {
          if ((RVar8 != RESOURCE_STATE_COPY_SOURCE) && (RVar8 != RESOURCE_STATE_RESOLVE_DEST))
          goto LAB_004dd359;
        }
        else if ((RVar8 != RESOURCE_STATE_RESOLVE_SOURCE) &&
                ((RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT && (RVar8 != RESOURCE_STATE_PRESENT)))) {
LAB_004dd359:
          if ((RVar8 != RESOURCE_STATE_MAX_BIT) &&
             (RVar8 != RESOURCE_STATE_COMMON || local_a0 != RENDER_DEVICE_TYPE_VULKAN)) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_
                      (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
            LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[3],std::__cxx11::string,char[14]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x96,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [37])"the final state of color attachment ",&PrsvAttachment,
                       (char (*) [3])0x6b3b90,&msg,(char (*) [14])") is invalid.");
            AdapterInfo = extraout_RDX_06;
            goto LAB_004dd57d;
          }
        }
      }
      RVar8 = PrsvAttachment + RESOURCE_STATE_UNDEFINED;
      _PrsvAttachment = (char *)CONCAT44(uStack_a4,RVar8);
    } while (RVar8 < *local_98);
  }
  local_d4 = 0;
  if (Desc->SubpassCount != 0) {
    bVar16 = local_a0 == RENDER_DEVICE_TYPE_VULKAN;
    local_38 = "INPUT_ATTACHMENT";
    if (bVar16) {
      local_38 = "INPUT_ATTACHMENT or COMMON";
    }
    local_40 = "RENDER_TARGET";
    if (bVar16) {
      local_40 = "RENDER_TARGET or COMMON";
    }
    local_50 = "DEPTH_READ or DEPTH_WRITE";
    if (bVar16) {
      local_50 = "DEPTH_READ, DEPTH_WRITE or COMMON";
    }
    local_58 = (local_78->ShadingRate).MinTileSize;
    local_68 = (local_78->ShadingRate).MaxTileSize;
    local_60 = (local_78->ShadingRate).MinTileSize + 1;
    local_70 = (local_78->ShadingRate).MaxTileSize + 1;
    local_90 = (ShadingRateAttachment *)0x0;
    do {
      pSVar5 = Desc->pSubpasses + local_d4;
      if ((pSVar5->InputAttachmentCount != 0) &&
         (pSVar5->pInputAttachments == (AttachmentReference *)0x0)) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[14],unsigned_int,char[47]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0xa2,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [29])"the input attachment count (",
                   &pSVar5->InputAttachmentCount,(char (*) [14])") of subpass ",&local_d4,
                   (char (*) [47])" is not zero, while pInputAttachments is null.");
        AdapterInfo = extraout_RDX_11;
      }
      pUVar1 = &pSVar5->RenderTargetAttachmentCount;
      if ((pSVar5->RenderTargetAttachmentCount != 0) &&
         (pSVar5->pRenderTargetAttachments == (AttachmentReference *)0x0)) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[14],unsigned_int,char[54]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0xa7,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [37])"the render target attachment count (",pUVar1,
                   (char (*) [14])") of subpass ",&local_d4,
                   (char (*) [54])" is not zero, while pRenderTargetAttachments is null.");
        AdapterInfo = extraout_RDX_12;
      }
      local_80 = &pSVar5->PreserveAttachmentCount;
      if ((pSVar5->PreserveAttachmentCount != 0) && (pSVar5->pPreserveAttachments == (Uint32 *)0x0))
      {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[14],unsigned_int,char[50]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0xac,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [32])"the preserve attachment count ("
                   ,local_80,(char (*) [14])") of subpass ",&local_d4,
                   (char (*) [50])" is not zero, while pPreserveAttachments is null.");
        AdapterInfo = extraout_RDX_13;
      }
      local_9c = 0;
      if (pSVar5->InputAttachmentCount != 0) {
        uVar11 = 0;
        do {
          RVar8 = pSVar5->pInputAttachments[uVar11].AttachmentIndex;
          AdapterInfo = (GraphicsAdapterInfo *)(ulong)RVar8;
          if (RVar8 != ~RESOURCE_STATE_UNKNOWN) {
            pAVar4 = pSVar5->pInputAttachments + uVar11;
            if (*local_98 <= RVar8) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[33],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xbc,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pAVar4->AttachmentIndex,(char (*) [33])") of input attachment reference ",
                         &local_9c,(char (*) [13])0x75a9cd,&local_d4,
                         (char (*) [47])" must be less than the number of attachments (",local_98,
                         (char (*) [3])0x75ce90);
              AdapterInfo = extraout_RDX_14;
            }
            RVar8 = pAVar4->State;
            if ((RVar8 != RESOURCE_STATE_INPUT_ATTACHMENT) &&
               (RVar8 != RESOURCE_STATE_COMMON || local_a0 != RENDER_DEVICE_TYPE_VULKAN)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              _PrsvAttachment = local_38;
              GetResourceStateString_abi_cxx11_
                        (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[44],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xc3,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar4->AttachmentIndex,
                         (char (*) [44])" referenced as input attachment in subpass ",&local_d4,
                         (char (*) [13])" must be in ",(char **)&PrsvAttachment,
                         (char (*) [32])0x75b0ac,&msg);
              AdapterInfo = extraout_RDX_15;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                AdapterInfo = extraout_RDX_16;
              }
            }
          }
          local_9c = local_9c + 1;
          uVar11 = (ulong)local_9c;
        } while (local_9c < pSVar5->InputAttachmentCount);
      }
      local_9c = 0;
      if (*pUVar1 != 0) {
        uVar11 = 0;
        do {
          RVar8 = pSVar5->pRenderTargetAttachments[uVar11].AttachmentIndex;
          AdapterInfo = (GraphicsAdapterInfo *)(ulong)RVar8;
          if (RVar8 != ~RESOURCE_STATE_UNKNOWN) {
            pAVar4 = pSVar5->pRenderTargetAttachments + uVar11;
            if (*local_98 <= RVar8) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xd4,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pAVar4->AttachmentIndex,
                         (char (*) [41])") of render target attachment reference ",&local_9c,
                         (char (*) [13])0x75a9cd,&local_d4,
                         (char (*) [47])" must be less than the number of attachments (",local_98,
                         (char (*) [3])0x75ce90);
              RVar8 = extraout_EDX;
            }
            RVar2 = pAVar4->State;
            if ((RVar2 != RESOURCE_STATE_RENDER_TARGET) &&
               (RVar2 != RESOURCE_STATE_COMMON || local_a0 != RENDER_DEVICE_TYPE_VULKAN)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              _PrsvAttachment = local_40;
              GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)RVar2,RVar8);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xdb,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar4->AttachmentIndex,
                         (char (*) [52])" referenced as render target attachment in subpass ",
                         &local_d4,(char (*) [13])" must be in ",(char **)&PrsvAttachment,
                         (char (*) [32])0x75b0ac,&msg);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            pTVar10 = GetTextureFormatAttribs(Desc->pAttachments[pAVar4->AttachmentIndex].Format);
            AdapterInfo = extraout_RDX_17;
            if ((pTVar10->ComponentType < 0xb) &&
               (AdapterInfo = (GraphicsAdapterInfo *)0x580,
               (0x580U >> (pTVar10->ComponentType & 0x1f) & 1) != 0)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[45]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xe5,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar4->AttachmentIndex,
                         (char (*) [52])" referenced as render target attachment in subpass ",
                         &local_d4,(char (*) [14])" uses format ",&pTVar10->Name,
                         (char (*) [45])", which is not a valid render target format.");
              AdapterInfo = extraout_RDX_18;
            }
          }
          local_9c = local_9c + 1;
          uVar11 = (ulong)local_9c;
        } while (local_9c < *pUVar1);
      }
      pUVar15 = local_98;
      if ((pSVar5->pResolveAttachments != (AttachmentReference *)0x0) &&
         (local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000), *pUVar1 != 0)) {
        uVar9 = 0;
        do {
          AdapterInfo = (GraphicsAdapterInfo *)(ulong)uVar9;
          RVar8 = pSVar5->pResolveAttachments[(long)AdapterInfo].AttachmentIndex;
          if ((RVar8 != ~RESOURCE_STATE_UNKNOWN) && (*pUVar15 <= RVar8)) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[35],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0xf8,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       &pSVar5->pResolveAttachments[(long)AdapterInfo].AttachmentIndex,
                       (char (*) [35])") of resolve attachment reference ",(uint *)&local_d0,
                       (char (*) [13])0x75a9cd,&local_d4,
                       (char (*) [47])" must be less than the number of attachments (",pUVar15,
                       (char (*) [3])0x75ce90);
            AdapterInfo = extraout_RDX_19;
            uVar9 = (uint)local_d0;
          }
          uVar9 = uVar9 + 1;
          local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar9);
        } while (uVar9 < *pUVar1);
      }
      RVar8 = (RESOURCE_STATE)AdapterInfo;
      pAVar4 = pSVar5->pDepthStencilAttachment;
      if ((pAVar4 != (AttachmentReference *)0x0) &&
         (pAVar4->AttachmentIndex != ~RESOURCE_STATE_UNKNOWN)) {
        if (*local_98 <= pAVar4->AttachmentIndex) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[47],unsigned_int,char[3]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x109,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                     &pAVar4->AttachmentIndex,
                     (char (*) [52])") of depth-stencil attachment reference of subpass ",&local_d4,
                     (char (*) [47])" must be less than the number of attachments (",local_98,
                     (char (*) [3])0x75ce90);
          RVar8 = extraout_EDX_00;
        }
        RVar2 = pAVar4->State;
        if (((RVar2 != RESOURCE_STATE_DEPTH_WRITE) && (RVar2 != RESOURCE_STATE_DEPTH_READ)) &&
           ((local_a0 != RENDER_DEVICE_TYPE_VULKAN || (RVar2 != RESOURCE_STATE_COMMON)))) {
          local_d0 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_d0 == (char *)0x0) {
            local_d0 = "";
          }
          _PrsvAttachment = local_50;
          GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)RVar2,RVar8);
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x110,(char (*) [29])"Description of render pass \'",&local_d0,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     &pAVar4->AttachmentIndex,
                     (char (*) [52])" referenced as depth stencil attachment in subpass ",&local_d4,
                     (char (*) [13])" must be in ",(char **)&PrsvAttachment,(char (*) [32])0x75b0ac,
                     &msg);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        pTVar10 = GetTextureFormatAttribs(Desc->pAttachments[pAVar4->AttachmentIndex].Format);
        AdapterInfo = extraout_RDX_20;
        if (1 < (byte)(pTVar10->ComponentType - COMPONENT_TYPE_DEPTH)) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[44]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x119,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     &pAVar4->AttachmentIndex,
                     (char (*) [52])" referenced as depth-stencil attachment in subpass ",&local_d4,
                     (char (*) [14])" uses format ",&pTVar10->Name,
                     (char (*) [44])", which is not a valid depth buffer format.");
          AdapterInfo = extraout_RDX_21;
        }
      }
      pUVar15 = local_98;
      local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000);
      if (*local_80 != 0) {
        uVar11 = 0;
        do {
          RVar8 = pSVar5->pPreserveAttachments[uVar11];
          _PrsvAttachment = (char *)CONCAT44(uStack_a4,RVar8);
          if (RVar8 == ~RESOURCE_STATE_UNKNOWN) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[55],unsigned_int,char[13],unsigned_int,char[23]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x126,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [55])"the attachment index of preserve attachment reference ",
                       (uint *)&local_d0,(char (*) [13])0x75a9cd,&local_d4,(char (*) [23])0x75ae7d);
            AdapterInfo = extraout_RDX_22;
            RVar8 = PrsvAttachment;
          }
          if (*pUVar15 <= RVar8) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[36],unsigned_int,char[13],unsigned_int,char[37],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,300,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       &PrsvAttachment,(char (*) [36])") of preserve attachment reference ",
                       (uint *)&local_d0,(char (*) [13])0x75a9cd,&local_d4,
                       (char (*) [37])" exceeds the number of attachments (",pUVar15,
                       (char (*) [3])0x75ce90);
            AdapterInfo = extraout_RDX_23;
          }
          uVar9 = (uint)local_d0 + 1;
          uVar11 = (ulong)uVar9;
          local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar9);
        } while (uVar9 < *local_80);
      }
      if ((pSVar5->pResolveAttachments != (AttachmentReference *)0x0) &&
         (local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000), pUVar15 = local_98,
         *pUVar1 != 0)) {
        uVar9 = 0;
        do {
          Args_4 = pSVar5->pRenderTargetAttachments + uVar9;
          pAVar4 = pSVar5->pResolveAttachments + uVar9;
          uVar9 = pAVar4->AttachmentIndex;
          if (uVar9 != 0xffffffff) {
            uVar13 = Args_4->AttachmentIndex;
            if (uVar13 == 0xffffffff) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[47],unsigned_int,char[102]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x13c,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [32])"pResolveAttachments of subpass ",&local_d4,
                         (char (*) [47])" is not null and resolve attachment reference ",
                         (uint *)&local_d0,
                         (char (*) [102])
                         " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED."
                        );
              uVar9 = pAVar4->AttachmentIndex;
              AdapterInfo = extraout_RDX_24;
              if (uVar9 == 0xffffffff) goto LAB_004de15b;
              uVar13 = Args_4->AttachmentIndex;
            }
            AdapterInfo = (GraphicsAdapterInfo *)Desc->pAttachments;
            if (AdapterInfo->Description[(ulong)uVar13 * 0x10 + 2] == '\x01') {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x146,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [35])"Render target attachment at index ",
                         &Args_4->AttachmentIndex,(char (*) [15])" referenced by",
                         (char (*) [23])0x75ae17,(uint *)&local_d0,(char (*) [13])0x75a9cd,&local_d4
                         ,(char (*) [72])
                          " is used as the source of resolve operation, but its sample count is 1.")
              ;
              uVar9 = pAVar4->AttachmentIndex;
              AdapterInfo = extraout_RDX_25;
              if (uVar9 == 0xffffffff) goto LAB_004de15b;
            }
            if (Desc->pAttachments[uVar9].SampleCount != '\x01') {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[30]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x150,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [29])"Resolve attachment at index ",&pAVar4->AttachmentIndex,
                         (char (*) [15])" referenced by",(char (*) [23])0x75ae17,(uint *)&local_d0,
                         (char (*) [13])0x75a9cd,&local_d4,
                         (char (*) [30])" must have sample count of 1.");
              AdapterInfo = extraout_RDX_26;
            }
          }
LAB_004de15b:
          if ((ulong)Args_4->AttachmentIndex != 0xffffffff) {
            AdapterInfo = (GraphicsAdapterInfo *)0xffffffff;
            if ((ulong)pAVar4->AttachmentIndex != 0xffffffff) {
              AdapterInfo = (GraphicsAdapterInfo *)Desc->pAttachments;
              if (*(TEXTURE_FORMAT *)
                   (AdapterInfo->Description + (ulong)Args_4->AttachmentIndex * 0x10) !=
                  *(TEXTURE_FORMAT *)
                   (AdapterInfo->Description + (ulong)pAVar4->AttachmentIndex * 0x10)) {
                msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
                if (msg._M_dataplus._M_p == (char *)0x0) {
                  msg._M_dataplus._M_p = "";
                }
                pTVar10 = GetTextureFormatAttribs
                                    (*(TEXTURE_FORMAT *)
                                      (AdapterInfo->Description +
                                      (ulong)Args_4->AttachmentIndex * 0x10));
                Args_12 = GetTextureFormatAttribs
                                    (Desc->pAttachments[pAVar4->AttachmentIndex].Format);
                LogError<true,char[29],char_const*,char[15],char[13],char_const*,char[40],unsigned_int,char[37],unsigned_int,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
                          (false,"ValidateRenderPassDesc",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                           ,0x160,(char (*) [29])"Description of render pass \'",(char **)&msg,
                           (char (*) [15])"\' is invalid: ",(char (*) [13])"The format (",
                           &pTVar10->Name,(char (*) [40])") of render target attachment at index ",
                           &Args_4->AttachmentIndex,
                           (char (*) [37])" referenced by attachment reference ",(uint *)&local_d0,
                           (char (*) [13])0x75a9cd,&local_d4,
                           (char (*) [29])" does not match the format (",&Args_12->Name,
                           (char (*) [52])") of the corresponding resolve attachment at index ",
                           &pAVar4->AttachmentIndex,(char (*) [2])0x75a69e);
                AdapterInfo = extraout_RDX_27;
              }
            }
          }
          uVar9 = (uint)local_d0 + 1;
          local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar9);
          pUVar15 = local_98;
        } while (uVar9 < *pUVar1);
      }
      pSVar12 = pSVar5->pShadingRateAttachment;
      if (pSVar12 != (ShadingRateAttachment *)0x0) {
        if (local_90 == (ShadingRateAttachment *)0x0) {
          local_90 = pSVar12;
        }
        RVar8 = (pSVar12->Attachment).AttachmentIndex;
        if (RVar8 != ~RESOURCE_STATE_UNKNOWN) {
          if (*pUVar15 <= RVar8) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[47],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x16e,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       (uint *)pSVar12,
                       (char (*) [51])") of shading rate attachment reference of subpass ",&local_d4
                       ,(char (*) [47])" must be less than the number of attachments (",pUVar15,
                       (char (*) [3])0x75ce90);
            AdapterInfo = extraout_RDX_28;
          }
          if ((local_48->Features).VariableRateShading == DEVICE_FEATURE_STATE_DISABLED) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[87]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x172,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [9])0x75a9d1,&local_d4,
                       (char (*) [87])
                       " uses a shading rate attachment, but VariableRateShading device feature is not enabled"
                      );
            AdapterInfo = extraout_RDX_29;
          }
          RVar8 = (pSVar12->Attachment).State;
          if (RVar8 != RESOURCE_STATE_MAX_BIT) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_
                      (&msg,(Diligent *)(ulong)RVar8,(RESOURCE_STATE)AdapterInfo);
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[56],std::__cxx11::string>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x177,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                       (uint *)pSVar12,
                       (char (*) [51])" referenced as shading rate attachment in subpass ",&local_d4
                       ,(char (*) [56])" must be in SHADING_RATE state, but specified state is ",
                       &msg);
            AdapterInfo = extraout_RDX_30;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              AdapterInfo = extraout_RDX_31;
            }
          }
          pSVar12 = pSVar5->pShadingRateAttachment;
          uVar9 = pSVar12->TileSize[0];
          if ((uVar9 != 0) || (pSVar12->TileSize[1] != 0)) {
            pUVar1 = pSVar12->TileSize;
            if ((uVar9 < *local_58) || (*local_68 < uVar9)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x181,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x75a9d1,&local_d4,
                         (char (*) [47])" uses shading rate attachment with tile width ",pUVar1,
                         (char (*) [36])" that is not in the allowed range [",local_58,
                         (char (*) [3])0x7b1039,local_68,
                         (char (*) [67])
                         "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
              AdapterInfo = extraout_RDX_32;
            }
            uVar9 = pSVar12->TileSize[1];
            pUVar15 = pSVar12->TileSize + 1;
            if ((uVar9 < *local_60) || (*local_70 < uVar9)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[48],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x187,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x75a9d1,&local_d4,
                         (char (*) [48])" uses shading rate attachment with tile height ",pUVar15,
                         (char (*) [36])" that is not in the allowed range [",local_60,
                         (char (*) [3])0x7b1039,local_70,
                         (char (*) [67])
                         "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
              uVar9 = *pUVar15;
              AdapterInfo = extraout_RDX_33;
            }
            if (*pUVar1 != uVar9) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[39],unsigned_int,char[2]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x18d,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x75a9d1,&local_d4,
                         (char (*) [47])" uses shading rate attachment with tile width ",pUVar1,
                         (char (*) [39])" that is not equal to the tile height ",pUVar15,
                         (char (*) [2])0x75a69e);
              uVar9 = *pUVar1;
              AdapterInfo = extraout_RDX_34;
            }
            if (((uVar9 ^ uVar9 - 1) <= uVar9 - 1) ||
               (uVar9 = *pUVar15 - 1, (*pUVar15 ^ uVar9) <= uVar9)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              local_d0 = (char *)CONCAT71(local_d0._1_7_,0x78);
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char,unsigned_int,char[31]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x192,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x75a9d1,&local_d4,
                         (char (*) [47])" uses shading rate attachment with tile sizes ",pUVar1,
                         (char *)&local_d0,pUVar15,(char (*) [31])" that are not a powers of two.");
              AdapterInfo = extraout_RDX_35;
            }
          }
        }
      }
      local_d4 = local_d4 + 1;
    } while (local_d4 < Desc->SubpassCount);
    if (((local_90 != (ShadingRateAttachment *)0x0) &&
        (((local_78->ShadingRate).CapFlags & SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS
         ) != SHADING_RATE_CAP_FLAG_NONE)) &&
       (local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000), Desc->SubpassCount != 0)) {
      uVar9 = 0;
      do {
        pSVar5 = Desc->pSubpasses;
        pSVar12 = pSVar5[uVar9].pShadingRateAttachment;
        if (pSVar12 == (ShadingRateAttachment *)0x0) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[57],unsigned_int,char[198]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x1a3,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",
                     (char (*) [57])"render pass uses a shading rate attachment, but subpass ",
                     (uint *)&local_d0,
                     (char (*) [198])
                     " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                    );
          pSVar12 = pSVar5[uVar9].pShadingRateAttachment;
        }
        iVar18 = -(uint)((local_90->Attachment).AttachmentIndex ==
                        (pSVar12->Attachment).AttachmentIndex);
        iVar19 = -(uint)((local_90->Attachment).State == (pSVar12->Attachment).State);
        auVar17._4_4_ = iVar18;
        auVar17._0_4_ = iVar18;
        auVar17._8_4_ = iVar19;
        auVar17._12_4_ = iVar19;
        iVar18 = movmskpd((int)local_90,auVar17);
        Args_1 = (ShadingRateAttachment *)CONCAT44((int)((ulong)local_90 >> 0x20),iVar18);
        if (((iVar18 != 3) ||
            (Args_1 = (ShadingRateAttachment *)(ulong)pSVar12->TileSize[0],
            pSVar12->TileSize[0] != local_90->TileSize[0])) ||
           (Args_1 = local_90, pSVar12->TileSize[1] != local_90->TileSize[1])) {
          if ((uint)local_d0 == 0) {
            FormatString<char[26],char[12]>
                      (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"subpass > 0",
                       (char (*) [12])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[36],unsigned_int,char[236]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x1ac,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [36])0x75b070,(uint *)&local_d0,
                     (char (*) [236])
                     " does not match the shading rate attachment used by previous subpasses. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                    );
        }
        uVar9 = (uint)local_d0 + 1;
        local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar9);
      } while (uVar9 < Desc->SubpassCount);
    }
  }
  local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000);
  if (*local_88 != 0) {
    uVar9 = 0;
    do {
      pSVar6 = Desc->pDependencies;
      if (pSVar6[uVar9].SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[15]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1b7,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [45])"the source stage mask of subpass dependency ",(uint *)&local_d0,
                   (char (*) [15])0x75bc14);
      }
      if (pSVar6[uVar9].DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[50],unsigned_int,char[15]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1bb,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [50])"the destination stage mask of subpass dependency ",
                   (uint *)&local_d0,(char (*) [15])0x75bc14);
      }
      uVar9 = (uint)local_d0 + 1;
      local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar9);
    } while (uVar9 < *local_88);
  }
  return;
}

Assistant:

void ValidateRenderPassDesc(const RenderPassDesc&      Desc,
                            const RenderDeviceInfo&    DeviceInfo,
                            const GraphicsAdapterInfo& AdapterInfo) noexcept(false)
{
#define LOG_RENDER_PASS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of render pass '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    const DeviceFeatures&        Features = DeviceInfo.Features;
    const ShadingRateProperties& SRProps  = AdapterInfo.ShadingRate;
    const bool                   IsVulkan = DeviceInfo.IsVulkanDevice();

    if (Desc.AttachmentCount != 0 && Desc.pAttachments == nullptr)
    {
        // If attachmentCount is not 0, pAttachments must be a valid pointer to an
        // array of attachmentCount valid VkAttachmentDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pAttachments-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the attachment count (", Desc.AttachmentCount, ") is not zero, but pAttachments is null.");
    }

    if (Desc.SubpassCount == 0)
    {
        // subpassCount must be greater than 0.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-subpassCount-arraylength
        LOG_RENDER_PASS_ERROR_AND_THROW("render pass must have at least one subpass.");
    }
    if (Desc.pSubpasses == nullptr)
    {
        // pSubpasses must be a valid pointer to an array of subpassCount valid VkSubpassDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pSubpasses-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("pSubpasses must not be null.");
    }

    if (Desc.DependencyCount != 0 && Desc.pDependencies == nullptr)
    {
        // If dependencyCount is not 0, pDependencies must be a valid pointer to an array of
        // dependencyCount valid VkSubpassDependency structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pDependencies-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the dependency count (", Desc.DependencyCount, ") is not zero, but pDependencies is null.");
    }

    for (Uint32 i = 0; i < Desc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attachment = Desc.pAttachments[i];
        if (Attachment.Format == TEX_FORMAT_UNKNOWN)
            LOG_RENDER_PASS_ERROR_AND_THROW("the format of attachment ", i, " is unknown.");

        if (Attachment.SampleCount == 0)
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count of attachment ", i, " is zero.");

        if (!IsPowerOfTwo(Attachment.SampleCount))
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count (", Uint32{Attachment.SampleCount}, ") of attachment ", i, " is not power of two.");

        const TextureFormatAttribs& FmtInfo = GetTextureFormatAttribs(Attachment.Format);
        if (FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH ||
            FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attachment.InitialState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.InitialState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.FinalState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
        else
        {
            if (Attachment.InitialState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_PRESENT &&
                Attachment.InitialState != RESOURCE_STATE_SHADING_RATE &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of color attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.FinalState != RESOURCE_STATE_PRESENT &&
                Attachment.FinalState != RESOURCE_STATE_SHADING_RATE &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of color attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
    }

    const ShadingRateAttachment* pShadingRateAttachment = nullptr;
    for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
    {
        const SubpassDesc& Subpass = Desc.pSubpasses[subpass];
        if (Subpass.InputAttachmentCount != 0 && Subpass.pInputAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the input attachment count (", Subpass.InputAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pInputAttachments is null.");
        }
        if (Subpass.RenderTargetAttachmentCount != 0 && Subpass.pRenderTargetAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the render target attachment count (", Subpass.RenderTargetAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pRenderTargetAttachments is null.");
        }
        if (Subpass.PreserveAttachmentCount != 0 && Subpass.pPreserveAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the preserve attachment count (", Subpass.PreserveAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pPreserveAttachments is null.");
        }

        for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pInputAttachments[input_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of input attachment reference ", input_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_INPUT_ATTACHMENT || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as input attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "INPUT_ATTACHMENT or COMMON" : "INPUT_ATTACHMENT"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }
        }

        for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of render target attachment reference ", rt_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_RENDER_TARGET || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "RENDER_TARGET or COMMON" : "RENDER_TARGET"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }

            const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " uses format ", FmtAttribs.Name, ", which is not a valid render target format.");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 rslv_attachment = 0; rslv_attachment < Subpass.RenderTargetAttachmentCount; ++rslv_attachment)
            {
                const AttachmentReference& AttchRef = Subpass.pResolveAttachments[rslv_attachment];
                if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                    continue;

                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of resolve attachment reference ", rslv_attachment,
                                                    " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }
            }
        }

        if (Subpass.pDepthStencilAttachment != nullptr)
        {
            const AttachmentReference& AttchRef = *Subpass.pDepthStencilAttachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of depth-stencil attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!(AttchRef.State == RESOURCE_STATE_DEPTH_READ || AttchRef.State == RESOURCE_STATE_DEPTH_WRITE || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth stencil attachment in subpass ", subpass,
                                                    " must be in ", (IsVulkan ? "DEPTH_READ, DEPTH_WRITE or COMMON" : "DEPTH_READ or DEPTH_WRITE"),
                                                    " state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
                const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
                if (FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH &&
                    FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth-stencil attachment in subpass ", subpass,
                                                    " uses format ", FmtAttribs.Name, ", which is not a valid depth buffer format.");
                }
            }
        }

        for (Uint32 prsv_attachment = 0; prsv_attachment < Subpass.PreserveAttachmentCount; ++prsv_attachment)
        {
            const Uint32 PrsvAttachment = Subpass.pPreserveAttachments[prsv_attachment];
            if (PrsvAttachment == ATTACHMENT_UNUSED)
            {
                // The attachment member of each element of pPreserveAttachments must not be VK_ATTACHMENT_UNUSED
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-attachment-00853
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " is ATTACHMENT_UNUSED.");
            }

            if (PrsvAttachment >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", PrsvAttachment, ") of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " exceeds the number of attachments (", Desc.AttachmentCount, ").");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 attchmnt = 0; attchmnt < Subpass.RenderTargetAttachmentCount; ++attchmnt)
            {
                const AttachmentReference& RTAttachmentRef   = Subpass.pRenderTargetAttachments[attchmnt];
                const AttachmentReference& RslvAttachmentRef = Subpass.pResolveAttachments[attchmnt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RTAttachmentRef.AttachmentIndex == ATTACHMENT_UNUSED)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not be VK_ATTACHMENT_UNUSED
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00847
                    LOG_RENDER_PASS_ERROR_AND_THROW("pResolveAttachments of subpass ", subpass, " is not null and resolve attachment reference ", attchmnt,
                                                    " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RTAttachmentRef.AttachmentIndex].SampleCount == 1)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00848
                    LOG_RENDER_PASS_ERROR_AND_THROW("Render target attachment at index ", RTAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " is used as the source of resolve operation, but its sample count is 1.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].SampleCount != 1)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED must
                    // have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00849
                    LOG_RENDER_PASS_ERROR_AND_THROW("Resolve attachment at index ", RslvAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " must have sample count of 1.");
                }

                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED &&
                    Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format != Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED
                    // must have the same VkFormat as its corresponding color attachment.
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00850
                    LOG_RENDER_PASS_ERROR_AND_THROW("The format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of render target attachment at index ", RTAttachmentRef.AttachmentIndex,
                                                    " referenced by attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " does not match the format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of the corresponding resolve attachment at index ",
                                                    RslvAttachmentRef.AttachmentIndex, ".");
                }
            }
        }

        if (Subpass.pShadingRateAttachment != nullptr)
        {
            pShadingRateAttachment              = pShadingRateAttachment != nullptr ? pShadingRateAttachment : Subpass.pShadingRateAttachment;
            const AttachmentReference& AttchRef = Subpass.pShadingRateAttachment->Attachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of shading rate attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!Features.VariableRateShading)
                    LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses a shading rate attachment, but VariableRateShading device feature is not enabled");

                if (AttchRef.State != RESOURCE_STATE_SHADING_RATE)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as shading rate attachment in subpass ", subpass,
                                                    " must be in SHADING_RATE state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const auto& TileSize = Subpass.pShadingRateAttachment->TileSize;
                if (TileSize[0] != 0 || TileSize[1] != 0)
                {
                    if (TileSize[0] < SRProps.MinTileSize[0] || TileSize[0] > SRProps.MaxTileSize[0])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[0], ", ", SRProps.MaxTileSize[0],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[1] < SRProps.MinTileSize[1] || TileSize[1] > SRProps.MaxTileSize[1])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile height ", TileSize[1],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[1], ", ", SRProps.MaxTileSize[1],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[0] != TileSize[1])
                    {
                        // The tile size is only used for Vulkan shading rate and current hardware only supports aspect ratio of 1.
                        // TODO: use VkPhysicalDeviceFragmentShadingRatePropertiesKHR::maxFragmentShadingRateAttachmentTexelSizeAspectRatio
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0], " that is not equal to the tile height ", TileSize[1], ".");
                    }
                    if (!IsPowerOfTwo(TileSize[0]) || !IsPowerOfTwo(TileSize[1]))
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile sizes ", TileSize[0], 'x', TileSize[1],
                                                        " that are not a powers of two.");
                    }
                }
            }
        }
    }

    if (pShadingRateAttachment != nullptr && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS) != SHADING_RATE_CAP_FLAG_NONE)
    {
        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& Subpass = Desc.pSubpasses[subpass];

            if (Subpass.pShadingRateAttachment == nullptr)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("render pass uses a shading rate attachment, but subpass ", subpass,
                                                " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS "
                                                "capability requires that all subpasses of a render pass use the same shading rate attachment.");
            }

            if (*Subpass.pShadingRateAttachment != *pShadingRateAttachment)
            {
                VERIFY_EXPR(subpass > 0);
                LOG_RENDER_PASS_ERROR_AND_THROW("shading rate attachment in subpass ", subpass,
                                                " does not match the shading rate attachment used by previous subpasses. "
                                                "A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability "
                                                "requires that all subpasses of a render pass use the same shading rate attachment.");
            }
        }
    }

    for (Uint32 i = 0; i < Desc.DependencyCount; ++i)
    {
        const SubpassDependencyDesc& Dependency = Desc.pDependencies[i];

        if (Dependency.SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the source stage mask of subpass dependency ", i, " is undefined.");
        }
        if (Dependency.DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the destination stage mask of subpass dependency ", i, " is undefined.");
        }
    }
}